

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixSetSystemCall(sqlite3_vfs *pNotUsed,char *zName,sqlite3_syscall_ptr pNewFunc)

{
  int iVar1;
  int local_28;
  uint local_24;
  int rc;
  uint i;
  sqlite3_syscall_ptr pNewFunc_local;
  char *zName_local;
  sqlite3_vfs *pNotUsed_local;
  
  local_28 = 0xc;
  if (zName == (char *)0x0) {
    local_28 = 0;
    for (local_24 = 0; local_24 < 0x1d; local_24 = local_24 + 1) {
      if (aSyscall[local_24].pDefault != (sqlite3_syscall_ptr)0x0) {
        aSyscall[local_24].pCurrent = aSyscall[local_24].pDefault;
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < 0x1d; local_24 = local_24 + 1) {
      iVar1 = strcmp(zName,aSyscall[local_24].zName);
      if (iVar1 == 0) {
        if (aSyscall[local_24].pDefault == (sqlite3_syscall_ptr)0x0) {
          aSyscall[local_24].pDefault = aSyscall[local_24].pCurrent;
        }
        _rc = pNewFunc;
        if (pNewFunc == (sqlite3_syscall_ptr)0x0) {
          _rc = aSyscall[local_24].pDefault;
        }
        aSyscall[local_24].pCurrent = _rc;
        return 0;
      }
    }
  }
  return local_28;
}

Assistant:

static int unixSetSystemCall(
  sqlite3_vfs *pNotUsed,        /* The VFS pointer.  Not used */
  const char *zName,            /* Name of system call to override */
  sqlite3_syscall_ptr pNewFunc  /* Pointer to new system call value */
){
  unsigned int i;
  int rc = SQLITE_NOTFOUND;

  UNUSED_PARAMETER(pNotUsed);
  if( zName==0 ){
    /* If no zName is given, restore all system calls to their default
    ** settings and return NULL
    */
    rc = SQLITE_OK;
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( aSyscall[i].pDefault ){
        aSyscall[i].pCurrent = aSyscall[i].pDefault;
      }
    }
  }else{
    /* If zName is specified, operate on only the one system call
    ** specified.
    */
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ){
        if( aSyscall[i].pDefault==0 ){
          aSyscall[i].pDefault = aSyscall[i].pCurrent;
        }
        rc = SQLITE_OK;
        if( pNewFunc==0 ) pNewFunc = aSyscall[i].pDefault;
        aSyscall[i].pCurrent = pNewFunc;
        break;
      }
    }
  }
  return rc;
}